

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O0

Status __thiscall leveldb::anon_unknown_1::PosixEnv::GetTestDirectory(PosixEnv *this,string *result)

{
  __uid_t _Var1;
  char *pcVar2;
  string *in_RDX;
  Status local_a0;
  char local_98 [8];
  char buf [100];
  char *env;
  string *result_local;
  PosixEnv *this_local;
  
  pcVar2 = getenv("TEST_TMPDIR");
  if ((pcVar2 == (char *)0x0) || (*pcVar2 == '\0')) {
    _Var1 = geteuid();
    snprintf(local_98,100,"/tmp/leveldbtest-%d",(ulong)_Var1);
    std::__cxx11::string::operator=(in_RDX,local_98);
  }
  else {
    std::__cxx11::string::operator=(in_RDX,pcVar2);
  }
  (**(code **)(*(long *)result + 0x48))(&local_a0,result,in_RDX);
  Status::~Status(&local_a0);
  Status::OK();
  return (Status)(char *)this;
}

Assistant:

Status GetTestDirectory(std::string* result) override {
    const char* env = std::getenv("TEST_TMPDIR");
    if (env && env[0] != '\0') {
      *result = env;
    } else {
      char buf[100];
      std::snprintf(buf, sizeof(buf), "/tmp/leveldbtest-%d",
                    static_cast<int>(::geteuid()));
      *result = buf;
    }

    // The CreateDir status is ignored because the directory may already exist.
    CreateDir(*result);

    return Status::OK();
  }